

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O1

void TIFFSwabArrayOfShort(uint16_t *wp,tmsize_t n)

{
  ushort *puVar1;
  long lVar2;
  long lVar3;
  
  if (0 < n) {
    lVar3 = (long)wp + 1;
    lVar2 = n + 1;
    do {
      puVar1 = (ushort *)(lVar3 + -1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar3 = lVar3 + 2;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void TIFFSwabArrayOfShort(register uint16_t *wp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(uint16_t) == 2);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)wp;
        t = cp[1];
        cp[1] = cp[0];
        cp[0] = t;
        wp++;
    }
}